

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cpp
# Opt level: O2

void __thiscall log_test_DefaultConstructor_Test::TestBody(log_test_DefaultConstructor_Test *this)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 *puVar3;
  undefined8 uVar4;
  uint *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertHelper local_f8;
  AssertionResult gtest_ar;
  AssertHelperData *local_e0;
  log_name_list_type log_name_list [10];
  
  memcpy(log_name_list,&PTR_anon_var_dwarf_5a62_00143bc0,0xa0);
  local_f8.data_ = (AssertHelperData *)log_map_create(0x200);
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e0 = local_f8.data_;
  testing::internal::CmpHelperNE<log_map_type*,log_map_type*>
            ((internal *)&gtest_ar,"(log_map)__null","(log_map)map",(log_map_type **)&local_100,
             (log_map_type **)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x3e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (lVar9 = 0; lVar9 != 0xa0; lVar9 = lVar9 + 0x10) {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar1 = log_map_insert(local_e0,*(undefined8 *)((long)&log_name_list[0].name + lVar9),
                           (long)&log_name_list[0].value + lVar9);
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0",
               "(int)log_map_insert(map, log_name_list[iterator].name, (const void *)&log_name_list[iterator].value)"
               ,(int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x42,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  local_f8.data_ = (AssertHelperData *)log_map_size(local_e0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)log_name_list_size","(size_t)log_map_size(map)",
             (unsigned_long *)&local_100,(unsigned_long *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x45,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (lVar9 = 8; lVar9 != 0xa8; lVar9 = lVar9 + 0x10) {
    puVar3 = (undefined4 *)log_map_get(local_e0,*(undefined8 *)((long)log_name_list + lVar9 + -8));
    local_100._M_head_impl._0_4_ = *(undefined4 *)((long)&log_name_list[0].name + lVar9);
    local_f8.data_._0_4_ = *puVar3;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"(unsigned int)log_name_list[iterator].value",
               "(unsigned int)value",(uint *)&local_100,(uint *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x4d,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  uVar4 = log_map_iterator_begin(local_e0);
  while( true ) {
    iVar2 = log_map_iterator_end(uVar4);
    if (iVar2 == 0) break;
    pcVar11 = (char *)log_map_iterator_key(uVar4);
    puVar5 = (uint *)log_map_iterator_value(uVar4);
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    iVar2 = strcmp(log_name_list[*puVar5].name,pcVar11);
    local_f8.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0","(int)strcmp(log_name_list[value].name, key)",
               (int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0x58,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    log_map_iterator_next(uVar4);
  }
  uVar1 = log_map_destroy(local_e0);
  local_100._M_head_impl._0_4_ = uVar1;
  local_f8.data_ = local_f8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)log_map_destroy(map)","(int)0",(int *)&local_100,
             (int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x5b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (lVar9 = 0; lVar9 != 0xa0; lVar9 = lVar9 + 0x10) {
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_100._M_head_impl._4_4_ << 0x20);
    uVar1 = log_create(*(undefined8 *)((long)&log_name_list[0].name + lVar9));
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0","(int)log_create(log_name_list[iterator].name)",
               (int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,100,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_100._M_head_impl._4_4_ << 0x20);
  uVar4 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_stdio(_stdout);
  uVar1 = log_configure_impl(log_name_list[0].name,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[0].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x70,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_stdio(_stderr);
  uVar1 = log_configure_impl(log_name_list[1].name,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[1].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stderr))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x76,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar11 = log_name_list[2].name;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_file(log_name_list[2].name,"a+");
  uVar1 = log_configure_impl(pcVar11,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[2].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_file(log_name_list[2].name, \"a+\"))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x7c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar11 = log_name_list[3].name;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_syslog(log_name_list[3].name);
  uVar1 = log_configure_impl(pcVar11,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[3].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_syslog(log_name_list[3].name))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x82,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text();
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_socket("127.0.0.1",0x208);
  uVar1 = log_configure_impl(log_name_list[4].name,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[4].name, 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_socket(\"127.0.0.1\", 0x0208))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x88,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_stdio(_stdout);
  uVar1 = log_configure_impl(log_name_list[5].name,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[5].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x8e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_stdio(_stderr);
  uVar1 = log_configure_impl(log_name_list[6].name,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[6].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_stdio(stderr))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x94,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar11 = log_name_list[7].name;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_file(log_name_list[7].name,"a+");
  uVar1 = log_configure_impl(pcVar11,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[7].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_file(log_name_list[7].name, \"a+\"))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0x9a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar11 = log_name_list[8].name;
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_syslog(log_name_list[8].name);
  uVar1 = log_configure_impl(pcVar11,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[8].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_syslog(log_name_list[8].name))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xa0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_binary();
  uVar6 = log_policy_schedule_async();
  uVar7 = log_policy_storage_batch(0x10);
  uVar8 = log_policy_stream_socket("127.0.0.1",0x209);
  uVar1 = log_configure_impl(log_name_list[9].name,4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(log_name_list[9].name, 4, log_policy_format_binary(), log_policy_schedule_async(), log_policy_storage_batch(storage_batch_size), log_policy_stream_socket(\"127.0.0.1\", 0x0209))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xa6,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (lVar9 = 0; lVar9 != 0xa0; lVar9 = lVar9 + 0x10) {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar1 = log_write_impl_va(*(undefined8 *)((long)&log_name_list[0].name + lVar9),0xaf,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"hello world");
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)175), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world\")"
               ,(int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xaf,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar1 = log_write_impl_va(*(undefined8 *)((long)&log_name_list[0].name + lVar9),0xb0,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"hell yeah");
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)176), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hell yeah\")"
               ,(int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xb0,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  lVar10 = 0;
  for (lVar9 = 1; lVar9 != 0xb; lVar9 = lVar9 + 1) {
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar1 = log_write_impl_va((&log_name_list[0].name)[lVar10],0xba,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"hello world from log (id : %zu)",lVar9 + -1);
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)186), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", iterator)"
               ,(int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xba,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar1 = log_write_impl_va(0x40410300bcbe61d0,(&log_name_list[0].name)[lVar10],0xbb,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"%zu %f",lVar9);
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)187), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"%\" \"z\" \"u\" \" %f\", iterator + 1, 34.02346)"
               ,(int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xbb,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
    uVar1 = log_write_impl_va((&log_name_list[0].name)[lVar10],0xbc,"TestBody",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                              ,1,"double log (id : %zu)",lVar10);
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0",
               "(int)log_write_impl_va(log_name_list[iterator].name, ((size_t)188), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"double log (id : %\" \"z\" \"u\" \")\", iterator * 2)"
               ,(int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xbc,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    lVar10 = lVar10 + 2;
  }
  for (lVar9 = 0; lVar9 != 0xa0; lVar9 = lVar9 + 0x10) {
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_100._M_head_impl._4_4_ << 0x20);
    uVar1 = log_clear(*(undefined8 *)((long)&log_name_list[0].name + lVar9));
    local_f8.data_._0_4_ = uVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"(int)0","(int)log_clear(log_name_list[iterator].name)",
               (int *)&local_100,(int *)&local_f8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      pcVar11 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar11 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                 ,0xc6,pcVar11);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_100._M_head_impl._4_4_ << 0x20);
  uVar4 = log_policy_format_text_flags(1);
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_stdio(_stdout);
  uVar1 = log_configure_impl("newline",4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(\"newline\", 4, log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("newline",0xd2,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NEW LINE A");
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)210), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NEW LINE A\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd2,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("newline",0xd3,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NEW LINE B");
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)211), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NEW LINE B\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd3,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("newline",0xd4,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x4d2);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)212), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 1234)"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd4,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("newline",0xd5,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x1538);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"newline\", ((size_t)213), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 5432)"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xd5,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar4 = log_policy_format_text_flags(0);
  uVar6 = log_policy_schedule_sync();
  uVar7 = log_policy_storage_sequential();
  uVar8 = log_policy_stream_stdio(_stdout);
  uVar1 = log_configure_impl("nonewline",4,uVar4,uVar6,uVar7,uVar8);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_configure_impl(\"nonewline\", 4, log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdb,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("nonewline",0xdd,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NO NEW LINE A");
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)221), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NO NEW LINE A\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdd,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("nonewline",0xde,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"NO NEW LINE B");
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)222), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"NO NEW LINE B\")"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xde,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("nonewline",0xdf,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x4d2);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)223), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 1234)"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xdf,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_write_impl_va("nonewline",0xe0,"TestBody",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
                            ,1,"hello world from log (id : %zu)",0x1538);
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0",
             "(int)log_write_impl_va(\"nonewline\", ((size_t)224), __func__, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp\", LOG_LEVEL_INFO, \"hello world from log (id : %\" \"z\" \"u\" \")\", 5432)"
             ,(int *)&local_100,(int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_clear("newline");
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0","(int)log_clear(\"newline\")",(int *)&local_100,
             (int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe2,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_100._M_head_impl = local_100._M_head_impl & 0xffffffff00000000;
  uVar1 = log_clear("nonewline");
  local_f8.data_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(int)0","(int)log_clear(\"nonewline\")",(int *)&local_100,
             (int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/log_test/source/log_test.cpp"
               ,0xe3,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_100._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_100._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(log_test, DefaultConstructor)
{
	struct log_name_list_type
	{
		const char *name;
		unsigned int value;
	} log_name_list[] = {
		{ "test_log_text_sync_seq_stdout", 0 },
		{ "test_log_text_sync_seq_stderr", 1 },
		{ "test_log_text_sync_seq_file", 2 },
		{ "test_log_text_sync_seq_syslog", 3 },
		{ "test_log_text_sync_seq_socket", 4 },
		{ "test_log_bin_async_bat_stdout", 5 },
		{ "test_log_bin_async_bat_stderr", 6 },
		{ "test_log_bin_async_bat_file", 7 },
		{ "test_log_bin_async_bat_syslog", 8 },
		{ "test_log_bin_async_bat_socket", 9 }
	};

	const size_t log_name_list_size = sizeof(log_name_list) / sizeof(log_name_list[0]);

	/* Log map */
	{
		size_t iterator;

		log_map_iterator map_iterator;

		log_map map = log_map_create((size_t)0x00000200);

		EXPECT_NE((log_map)NULL, (log_map)map);

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_map_insert(map, log_name_list[iterator].name, (const void *)&log_name_list[iterator].value));
		}

		EXPECT_EQ((size_t)log_name_list_size, (size_t)log_map_size(map));

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			const void *value_ptr = log_map_get(map, log_name_list[iterator].name);

			unsigned int value = *((unsigned int *)value_ptr);

			EXPECT_EQ((unsigned int)log_name_list[iterator].value, (unsigned int)value);
		}

		for (map_iterator = log_map_iterator_begin(map); log_map_iterator_end(map_iterator) != 0; log_map_iterator_next(map_iterator))
		{
			const char *key = log_map_iterator_key(map_iterator);

			const void *value_ptr = log_map_iterator_value(map_iterator);

			unsigned int value = *((unsigned int *)value_ptr);

			EXPECT_EQ((int)0, (int)strcmp(log_name_list[value].name, key));
		}

		EXPECT_EQ((int)log_map_destroy(map), (int)0);
	}

	/* Create logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_create(log_name_list[iterator].name));
		}
	}

	/* Set policies */
	{
		const size_t storage_batch_size = ((size_t)0x00000010);

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[0].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[1].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stderr)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[2].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_file(log_name_list[2].name, "a+")));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[3].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_syslog(log_name_list[3].name)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[4].name,
							  log_policy_format_text(),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_socket("127.0.0.1", UINT16_C(0x0208))));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[5].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[6].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_stdio(stderr)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[7].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_file(log_name_list[7].name, "a+")));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[8].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_syslog(log_name_list[8].name)));

		EXPECT_EQ((int)0, (int)log_configure(log_name_list[9].name,
							  log_policy_format_binary(),
							  log_policy_schedule_async(),
							  log_policy_storage_batch(storage_batch_size),
							  log_policy_stream_socket("127.0.0.1", UINT16_C(0x0209))));
	}

	/* Write simple logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hello world"));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hell yeah"));
		}
	}

	/* Write varidic logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", iterator));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "%" PRIuS " %f", iterator + 1, 34.02346));
			EXPECT_EQ((int)0, (int)log_write(log_name_list[iterator].name, LOG_LEVEL_INFO, "double log (id : %" PRIuS ")", iterator * 2));
		}
	}

	/* Clear all logs */
	{
		size_t iterator;

		for (iterator = 0; iterator < log_name_list_size; ++iterator)
		{
			EXPECT_EQ((int)0, (int)log_clear(log_name_list[iterator].name));
		}
	}

	/* Policy format text flags */
	{
		EXPECT_EQ((int)0, (int)log_configure("newline",
							  log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "NEW LINE A"));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "NEW LINE B"));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 1234));
		EXPECT_EQ((int)0, (int)log_write("newline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 5432));

		EXPECT_EQ((int)0, (int)log_configure("nonewline",
							  log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
							  log_policy_schedule_sync(),
							  log_policy_storage_sequential(),
							  log_policy_stream_stdio(stdout)));

		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "NO NEW LINE A"));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "NO NEW LINE B"));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 1234));
		EXPECT_EQ((int)0, (int)log_write("nonewline", LOG_LEVEL_INFO, "hello world from log (id : %" PRIuS ")", 5432));

		EXPECT_EQ((int)0, (int)log_clear("newline"));
		EXPECT_EQ((int)0, (int)log_clear("nonewline"));
	}
}